

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rowSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  undefined4 *puVar1;
  uint *puVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  int p_col;
  int iVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  pointer pnVar11;
  pointer pnVar12;
  undefined4 uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pval;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  piVar8 = (this->temp).s_mark;
  iVar4 = (this->temp).stage;
  lVar29 = (long)iVar4;
  if (0 < this->thedim) {
    piVar9 = (this->row).perm;
    piVar10 = (this->u).row.len;
    lVar27 = 0;
    do {
      if ((piVar9[lVar27] < 0) && (piVar10[lVar27] == 1)) {
        iVar5 = (this->temp).stage;
        (this->temp).stage = iVar5 + 1;
        piVar8[iVar5] = (int)lVar27;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 < this->thedim);
  }
  if (iVar4 < (this->temp).stage) {
    do {
      iVar4 = piVar8[lVar29];
      iVar5 = (this->u).row.start[iVar4];
      pnVar11 = (this->u).row.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_col = (this->u).row.idx[iVar5];
      local_128.data._M_elems._0_8_ = *(undefined8 *)pnVar11[iVar5].m_backend.data._M_elems;
      local_128.data._M_elems._8_8_ =
           *(undefined8 *)((long)pnVar11[iVar5].m_backend.data._M_elems + 8);
      puVar2 = (uint *)((long)pnVar11[iVar5].m_backend.data._M_elems + 0x10);
      local_128.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)pnVar11[iVar5].m_backend.data._M_elems + 0x20);
      local_128.data._M_elems._32_8_ = *(undefined8 *)puVar2;
      local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)pnVar11[iVar5].m_backend.data._M_elems + 0x30);
      local_128.data._M_elems._48_8_ = *(undefined8 *)puVar2;
      local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
      local_128.data._M_elems._56_5_ = local_88.m_backend.data._M_elems._56_5_;
      local_128.data._M_elems[0xf]._1_3_ = local_88.m_backend.data._M_elems[0xf]._1_3_;
      local_128.exp = pnVar11[iVar5].m_backend.exp;
      local_128.neg = pnVar11[iVar5].m_backend.neg;
      local_88.m_backend.fpclass = pnVar11[iVar5].m_backend.fpclass;
      local_88.m_backend.prec_elem = pnVar11[iVar5].m_backend.prec_elem;
      local_128.prec_elem = local_88.m_backend.prec_elem;
      local_128.fpclass = local_88.m_backend.fpclass;
      local_88.m_backend.data._M_elems._0_8_ = local_128.data._M_elems._0_8_;
      local_88.m_backend.data._M_elems._8_8_ = local_128.data._M_elems._8_8_;
      local_88.m_backend.data._M_elems._16_8_ = local_128.data._M_elems._16_8_;
      local_88.m_backend.data._M_elems._24_8_ = local_128.data._M_elems._24_8_;
      local_88.m_backend.data._M_elems._32_8_ = local_128.data._M_elems._32_8_;
      local_88.m_backend.data._M_elems._40_8_ = local_128.data._M_elems._40_8_;
      local_88.m_backend.data._M_elems._48_8_ = local_128.data._M_elems._48_8_;
      local_88.m_backend.exp = local_128.exp;
      local_88.m_backend.neg = local_128.neg;
      setPivot(this,(int)lVar29,p_col,iVar4,&local_88);
      (this->u).row.len[iVar4] = 0;
      iVar5 = (this->u).col.start[p_col];
      piVar9 = (this->u).col.idx;
      iVar6 = (this->temp).s_cact[p_col];
      iVar24 = makeLvec(this,iVar6 + -1,iVar4);
      piVar10 = (this->u).col.len;
      iVar7 = piVar10[p_col];
      iVar25 = iVar7 - iVar6;
      piVar10[p_col] = iVar25;
      if (0 < iVar6) {
        lVar27 = (long)iVar25;
        do {
          iVar6 = piVar9[iVar5 + lVar27];
          if (iVar6 != iVar4) {
            piVar10 = (this->u).row.len;
            iVar25 = piVar10[iVar6];
            piVar10[iVar6] = iVar25 + -1;
            lVar26 = (long)(iVar25 + -1 + (this->u).row.start[iVar6]);
            lVar22 = lVar26 * 4;
            lVar23 = lVar26 * 0x50 + 0x50;
            do {
              lVar30 = lVar23;
              lVar28 = lVar22;
              lVar22 = lVar28 + -4;
              lVar23 = lVar30 + -0x50;
            } while (*(int *)((long)(this->u).row.idx + lVar28) != p_col);
            (this->l).idx[iVar24] = iVar6;
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 0x10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems[6] = 0;
            local_d8.data._M_elems[7] = 0;
            local_d8.data._M_elems[8] = 0;
            local_d8.data._M_elems[9] = 0;
            local_d8.data._M_elems[10] = 0;
            local_d8.data._M_elems[0xb] = 0;
            local_d8.data._M_elems[0xc] = 0;
            local_d8.data._M_elems[0xd] = 0;
            local_d8.data._M_elems._56_5_ = 0;
            local_d8.data._M_elems[0xf]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_d8,
                       (cpp_dec_float<100U,_int,_void> *)
                       ((long)(this->u).row.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                       + lVar30),&local_128);
            pnVar11 = (this->l).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (uint *)((long)pnVar11[iVar24].m_backend.data._M_elems + 0x30);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._48_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_d8.data._M_elems[0xf]._1_3_,local_d8.data._M_elems._56_5_);
            puVar2 = (uint *)((long)pnVar11[iVar24].m_backend.data._M_elems + 0x20);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._32_8_;
            *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._40_8_;
            puVar2 = (uint *)((long)pnVar11[iVar24].m_backend.data._M_elems + 0x10);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._16_8_;
            *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._24_8_;
            *(undefined8 *)pnVar11[iVar24].m_backend.data._M_elems = local_d8.data._M_elems._0_8_;
            *(undefined8 *)((long)pnVar11[iVar24].m_backend.data._M_elems + 8) =
                 local_d8.data._M_elems._8_8_;
            pnVar11[iVar24].m_backend.exp = local_d8.exp;
            pnVar11[iVar24].m_backend.neg = local_d8.neg;
            pnVar11[iVar24].m_backend.fpclass = local_d8.fpclass;
            pnVar11[iVar24].m_backend.prec_elem = local_d8.prec_elem;
            iVar24 = iVar24 + 1;
            piVar10 = (this->u).row.idx;
            *(int *)((long)piVar10 + lVar28) = piVar10[lVar26];
            pnVar12 = (this->u).row.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar11 = pnVar12 + lVar26;
            uVar13 = (pnVar11->m_backend).data._M_elems[0];
            uVar14 = *(uint *)((long)(pnVar11->m_backend).data._M_elems + 4);
            uVar15 = *(uint *)((long)(pnVar11->m_backend).data._M_elems + 8);
            uVar16 = *(uint *)((long)(pnVar11->m_backend).data._M_elems + 0xc);
            puVar2 = (uint *)((long)pnVar12[lVar26].m_backend.data._M_elems + 0x10);
            uVar17 = *(undefined8 *)puVar2;
            uVar18 = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)pnVar12[lVar26].m_backend.data._M_elems + 0x20);
            uVar19 = *(undefined8 *)puVar2;
            uVar20 = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)pnVar12[lVar26].m_backend.data._M_elems + 0x30);
            uVar21 = *(undefined8 *)(puVar2 + 2);
            puVar3 = (undefined8 *)((long)pnVar12[-1].m_backend.data._M_elems + lVar30 + 0x30);
            *puVar3 = *(undefined8 *)puVar2;
            puVar3[1] = uVar21;
            puVar3 = (undefined8 *)((long)pnVar12[-1].m_backend.data._M_elems + lVar30 + 0x20);
            *puVar3 = uVar19;
            puVar3[1] = uVar20;
            puVar3 = (undefined8 *)((long)pnVar12[-1].m_backend.data._M_elems + lVar30 + 0x10);
            *puVar3 = uVar17;
            puVar3[1] = uVar18;
            puVar1 = (undefined4 *)((long)pnVar12[-1].m_backend.data._M_elems + lVar30);
            *puVar1 = uVar13;
            puVar1[1] = uVar14;
            puVar1[2] = uVar15;
            puVar1[3] = uVar16;
            *(int *)((long)(&pnVar12[-1].m_backend.data + 1) + lVar30) =
                 pnVar12[lVar26].m_backend.exp;
            *(bool *)((long)(&pnVar12[-1].m_backend.data + 1) + 4U + lVar30) =
                 pnVar12[lVar26].m_backend.neg;
            *(undefined8 *)((long)(&pnVar12[-1].m_backend.data + 1) + 8U + lVar30) =
                 *(undefined8 *)&pnVar12[lVar26].m_backend.fpclass;
            if (iVar25 == 2) {
              iVar25 = (this->temp).stage;
              (this->temp).stage = iVar25 + 1;
              piVar8[iVar25] = iVar6;
            }
            else if (iVar25 == 1) {
              this->stat = SINGULAR;
              return;
            }
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 < iVar7);
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 < (this->temp).stage);
  }
  return;
}

Assistant:

void CLUFactor<R>::rowSingletons()
{
   R pval;
   int i, j, k, ll, r;
   int p_row, p_col, len, rs, lk;
   int* idx;
   int* rperm = row.perm;
   int* sing = temp.s_mark;

   /*  Mark row singletons
    */
   rs = temp.stage;

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0 && u.row.len[i] == 1)
         sing[temp.stage++] = i;
   }

   /*  Eliminate row singletons
    *  thereby marking newly arising ones
    *  until no more can be found.
    */
   for(; rs < temp.stage; ++rs)
   {
      /*      Move pivot element from row file to diag
       */
      p_row = sing[rs];
      j = u.row.start[p_row];
      p_col = u.row.idx[j];
      pval = u.row.val[j];
      setPivot(rs, p_col, p_row, pval);
      u.row.len[p_row] = 0;

      /*      Remove pivot column form workingmatrix
       *      thereby building up L VectorBase<R>.
       */
      idx = &(u.col.idx[u.col.start[p_col]]);
      i = temp.s_cact[p_col];                /* nr. nonzeros of new L VectorBase<R> */
      lk = makeLvec(i - 1, p_row);
      len = u.col.len[p_col];
      i = (u.col.len[p_col] -= i);         /* remove pivot column from U */

      for(; i < len; ++i)
      {
         r = idx[i];

         if(r != p_row)
         {
            /*      Find pivot column in row.
             */
            ll = --(u.row.len[r]);
            k = u.row.start[r] + ll;

            for(j = k; u.row.idx[j] != p_col; --j)
               ;

            assert(k >= u.row.start[r]);

            /*      Initialize L VectorBase<R>
             */
            l.idx[lk] = r;

            l.val[lk] = u.row.val[j] / pval;

            ++lk;

            /*      Remove pivot column from row.
             */
            u.row.idx[j] = u.row.idx[k];

            u.row.val[j] = u.row.val[k];

            /*      Check new row length.
             */
            if(ll == 1)
               sing[temp.stage++] = r;
            else if(ll == 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }
         }
      }
   }
}